

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::PushHeader(XMLPrinter *this,bool writeBOM,bool writeDec)

{
  bool writeDec_local;
  bool writeBOM_local;
  XMLPrinter *this_local;
  
  if (writeBOM) {
    Write(this,(char *)PushHeader::bom);
  }
  if (writeDec) {
    PushDeclaration(this,"xml version=\"1.0\"");
  }
  return;
}

Assistant:

void XMLPrinter::PushHeader(bool writeBOM, bool writeDec)
{
    if (writeBOM) {
        static const unsigned char bom[] = {TIXML_UTF_LEAD_0,
                                            TIXML_UTF_LEAD_1,
                                            TIXML_UTF_LEAD_2,
                                            0};
        Write(reinterpret_cast<const char*>(bom));
    }
    if (writeDec) {
        PushDeclaration("xml version=\"1.0\"");
    }
}